

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O0

string * __thiscall
TargetFilesystemArtifactResultCreator<ArtifactPdbTag>::Create_abi_cxx11_
          (string *__return_storage_ptr__,
          TargetFilesystemArtifactResultCreator<ArtifactPdbTag> *this,cmGeneratorTarget *target,
          cmGeneratorExpressionContext *context,GeneratorExpressionContent *content)

{
  string *__return_storage_ptr___00;
  GeneratorExpressionContent *pGVar1;
  bool bVar2;
  cmMakefile *this_00;
  string local_198;
  undefined1 local_172;
  allocator local_171;
  string local_170;
  string local_150;
  TargetType local_12c;
  undefined4 local_128;
  TargetType targetType;
  string local_120;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string pdbSupportVar;
  string language;
  allocator local_69;
  string local_68;
  string local_48;
  cmGeneratorExpressionContext *local_28;
  GeneratorExpressionContent *content_local;
  cmGeneratorExpressionContext *context_local;
  cmGeneratorTarget *target_local;
  string *result;
  
  local_28 = context;
  content_local = (GeneratorExpressionContent *)target;
  context_local = (cmGeneratorExpressionContext *)this;
  target_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar2 = cmGeneratorTarget::IsImported((cmGeneratorTarget *)this);
  pGVar1 = content_local;
  if (bVar2) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
              (&local_48,(GeneratorExpressionContent *)local_28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_68,"TARGET_PDB_FILE not allowed for IMPORTED targets.",&local_69);
    reportError((cmGeneratorExpressionContext *)pGVar1,&local_48,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    __return_storage_ptr___00 = (string *)((long)&pdbSupportVar.field_2 + 8);
    cmGeneratorTarget::GetLinkerLanguage
              (__return_storage_ptr___00,(cmGeneratorTarget *)context_local,
               (string *)
               &content_local[4].IdentifierChildren.
                super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::operator+(&local_e0,"CMAKE_",__return_storage_ptr___00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                   &local_e0,"_LINKER_SUPPORTS_PDB");
    std::__cxx11::string::~string((string *)&local_e0);
    this_00 = cmLocalGenerator::GetMakefile
                        ((cmLocalGenerator *)
                         content_local[4].IdentifierChildren.
                         super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    bVar2 = cmMakefile::IsOn(this_00,(string *)local_c0);
    pGVar1 = content_local;
    if (bVar2) {
      local_12c = cmGeneratorTarget::GetType((cmGeneratorTarget *)context_local);
      pGVar1 = content_local;
      if (((local_12c == SHARED_LIBRARY) || (local_12c == MODULE_LIBRARY)) ||
         (local_12c == EXECUTABLE)) {
        local_172 = 0;
        cmGeneratorTarget::GetPDBDirectory
                  (__return_storage_ptr__,(cmGeneratorTarget *)context_local,
                   (string *)
                   &content_local[4].IdentifierChildren.
                    super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"/");
        cmGeneratorTarget::GetPDBName
                  (&local_198,(cmGeneratorTarget *)context_local,
                   (string *)
                   &content_local[4].IdentifierChildren.
                    super__Vector_base<cmGeneratorExpressionEvaluator_*,_std::allocator<cmGeneratorExpressionEvaluator_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_198);
        std::__cxx11::string::~string((string *)&local_198);
        local_172 = 1;
      }
      else {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                  (&local_150,(GeneratorExpressionContent *)local_28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_170,
                   "TARGET_PDB_FILE is allowed only for targets with linker created artifacts.",
                   &local_171);
        reportError((cmGeneratorExpressionContext *)pGVar1,&local_150,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
        std::allocator<char>::~allocator((allocator<char> *)&local_171);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
    }
    else {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_
                (&local_100,(GeneratorExpressionContent *)local_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_120,"TARGET_PDB_FILE is not supported by the target linker.",
                 (allocator *)((long)&targetType + 3));
      reportError((cmGeneratorExpressionContext *)pGVar1,&local_100,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)((long)&targetType + 3));
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    local_128 = 1;
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)(pdbSupportVar.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string Create(cmGeneratorTarget* target,
                            cmGeneratorExpressionContext *context,
                            const GeneratorExpressionContent *content)
  {
    if (target->IsImported())
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE not allowed for IMPORTED targets.");
      return std::string();
      }

    std::string language = target->GetLinkerLanguage(context->Config);

    std::string pdbSupportVar = "CMAKE_" + language + "_LINKER_SUPPORTS_PDB";

    if(!context->LG->GetMakefile()->IsOn(pdbSupportVar))
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is not supported by the target linker.");
      return std::string();
      }

    cmState::TargetType targetType = target->GetType();

    if(targetType != cmState::SHARED_LIBRARY &&
       targetType != cmState::MODULE_LIBRARY &&
       targetType != cmState::EXECUTABLE)
      {
      ::reportError(context, content->GetOriginalExpression(),
                    "TARGET_PDB_FILE is allowed only for "
                    "targets with linker created artifacts.");
      return std::string();
      }

    std::string result = target->GetPDBDirectory(context->Config);
    result += "/";
    result += target->GetPDBName(context->Config);
    return result;
  }